

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment.c
# Opt level: O0

mi_page_t *
mi_segments_page_find_and_allocate
          (size_t slice_count,mi_arena_id_t req_arena_id,mi_segments_tld_t *tld)

{
  mi_memid_t memid;
  _Bool _Var1;
  mi_slice_t *slice_00;
  mi_segment_t *pmVar2;
  mi_page_t *pmVar3;
  size_t in_RDX;
  undefined4 in_ESI;
  ulong in_RDI;
  mi_page_t *page;
  mi_segment_t *segment;
  mi_slice_t *slice;
  mi_span_queue_t *sq;
  mi_slice_t *slice_01;
  mi_segments_tld_t *in_stack_ffffffffffffffa8;
  mi_segments_tld_t *tld_00;
  size_t in_stack_ffffffffffffffb0;
  mi_slice_t *in_stack_ffffffffffffffb8;
  mi_segment_t *in_stack_ffffffffffffffc0;
  mi_segments_tld_t *tld_01;
  undefined4 in_stack_ffffffffffffffe8;
  ulong local_10;
  
  slice_00 = (mi_slice_t *)mi_span_queue_for(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  local_10 = in_RDI;
  if (in_RDI == 0) {
    local_10 = 1;
  }
  do {
    if ((mi_slice_t *)(in_RDX + 0x348) < slice_00) {
      return (mi_page_t *)0x0;
    }
    for (tld_01 = *(mi_segments_tld_t **)slice_00; tld_01 != (mi_segments_tld_t *)0x0;
        tld_01 = (mi_segments_tld_t *)tld_01->spans[3].first) {
      if (local_10 <= *(uint *)&tld_01->spans[0].first) {
        pmVar2 = _mi_ptr_segment(tld_01);
        slice_01 = (mi_slice_t *)(pmVar2->memid).mem.os.size;
        tld_00 = *(mi_segments_tld_t **)&(pmVar2->memid).is_pinned;
        memid.mem.os.size = (size_t)in_stack_ffffffffffffffb8;
        memid.mem.arena.block_index = in_stack_ffffffffffffffb0;
        memid._16_8_ = in_stack_ffffffffffffffc0;
        _Var1 = _mi_arena_memid_is_suitable(memid,(mi_arena_id_t)slice_01);
        if (_Var1) {
          mi_span_queue_delete((mi_span_queue_t *)slice_00,(mi_slice_t *)tld_01);
          if (local_10 < *(uint *)&tld_01->spans[0].first) {
            mi_segment_slice_split
                      (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0
                       ,tld_00);
          }
          mi_slice_index(slice_01);
          pmVar3 = mi_segment_span_allocate
                             ((mi_segment_t *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX,
                              (size_t)slice_00);
          if (pmVar3 != (mi_page_t *)0x0) {
            return pmVar3;
          }
          mi_segment_span_free_coalesce(slice_00,tld_01);
          return (mi_page_t *)0x0;
        }
      }
    }
    slice_00 = (mi_slice_t *)&slice_00->local_free;
  } while( true );
}

Assistant:

static mi_page_t* mi_segments_page_find_and_allocate(size_t slice_count, mi_arena_id_t req_arena_id, mi_segments_tld_t* tld) {
  mi_assert_internal(slice_count*MI_SEGMENT_SLICE_SIZE <= MI_LARGE_OBJ_SIZE_MAX);
  // search from best fit up
  mi_span_queue_t* sq = mi_span_queue_for(slice_count, tld);
  if (slice_count == 0) slice_count = 1;
  while (sq <= &tld->spans[MI_SEGMENT_BIN_MAX]) {
    for (mi_slice_t* slice = sq->first; slice != NULL; slice = slice->next) {
      if (slice->slice_count >= slice_count) {
        // found one
        mi_segment_t* segment = _mi_ptr_segment(slice);
        if (_mi_arena_memid_is_suitable(segment->memid, req_arena_id)) {
          // found a suitable page span
          mi_span_queue_delete(sq, slice);

          if (slice->slice_count > slice_count) {
            mi_segment_slice_split(segment, slice, slice_count, tld);
          }
          mi_assert_internal(slice != NULL && slice->slice_count == slice_count && slice->block_size > 0);
          mi_page_t* page = mi_segment_span_allocate(segment, mi_slice_index(slice), slice->slice_count);
          if (page == NULL) {
            // commit failed; return NULL but first restore the slice
            mi_segment_span_free_coalesce(slice, tld);
            return NULL;
          }
          return page;
        }
      }
    }
    sq++;
  }
  // could not find a page..
  return NULL;
}